

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.h
# Opt level: O3

bool __thiscall flow::Signature::operator!=(Signature *this,Signature *v)

{
  int iVar1;
  bool bVar2;
  string local_50;
  string local_30;
  
  to_s_abi_cxx11_(&local_50,this);
  to_s_abi_cxx11_(&local_30,v);
  if (local_50._M_string_length == local_30._M_string_length) {
    if (local_50._M_string_length == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = bcmp(local_50._M_dataplus._M_p,local_30._M_dataplus._M_p,local_50._M_string_length);
      bVar2 = iVar1 != 0;
    }
  }
  else {
    bVar2 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool operator!=(const Signature& v) const { return to_s() != v.to_s(); }